

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

void __thiscall TPZIntTriang::SetOrder(TPZIntTriang *this,TPZVec<int> *ord,int type)

{
  int iVar1;
  int *piVar2;
  TPZIntRuleT *pTVar3;
  TPZVec<int> *in_RSI;
  long in_RDI;
  TPZIntRuleList *unaff_retaddr;
  long lVar4;
  int order;
  
  lVar4 = in_RDI;
  piVar2 = TPZVec<int>::operator[](in_RSI,0);
  order = (int)((ulong)lVar4 >> 0x20);
  *(int *)(in_RDI + 8) = *piVar2;
  piVar2 = TPZVec<int>::operator[](in_RSI,1);
  iVar1 = *piVar2;
  piVar2 = TPZVec<int>::operator[](in_RSI,0);
  if (*piVar2 < iVar1) {
    piVar2 = TPZVec<int>::operator[](in_RSI,1);
    *(int *)(in_RDI + 8) = *piVar2;
  }
  piVar2 = TPZVec<int>::operator[](in_RSI,0);
  if (-1 < *piVar2) {
    piVar2 = TPZVec<int>::operator[](in_RSI,0);
    if (*piVar2 < 0x16) {
      piVar2 = TPZVec<int>::operator[](in_RSI,1);
      if (-1 < *piVar2) {
        piVar2 = TPZVec<int>::operator[](in_RSI,1);
        if (*piVar2 < 0x16) goto LAB_01139efb;
      }
    }
  }
  *(undefined4 *)(in_RDI + 8) = 0x15;
LAB_01139efb:
  pTVar3 = TPZIntRuleList::GetRuleT(unaff_retaddr,order);
  *(TPZIntRuleT **)(in_RDI + 0x10) = pTVar3;
  iVar1 = TPZIntRuleT::Order(*(TPZIntRuleT **)(in_RDI + 0x10));
  *(int *)(in_RDI + 8) = iVar1;
  return;
}

Assistant:

void TPZIntTriang::SetOrder(TPZVec<int> &ord,int type) {
#ifdef PZDEBUG
    if (type != 0) {
        DebugStop();
    }
#endif
	fOrdKsi = ord[0];
	if(ord[1] > ord[0]) fOrdKsi = ord[1];
	if(ord[0] < 0 || ord[0] > TPZIntRuleT::NRULESTRIANGLE_ORDER || ord[1] < 0 || ord[1] > TPZIntRuleT::NRULESTRIANGLE_ORDER) 
	{
#ifdef PZDEBUG
#ifdef PZ_LOG
		LOGPZ_WARN(logger,"Integration rule for triangle - Order is bigger than NRULESTRIANGLE_ORDER (Max)");
#endif
#endif
		
		fOrdKsi = TPZIntRuleT::NRULESTRIANGLE_ORDER;//havendo erro assume a maxima ordem
	}
	fIntKsi = TPZIntRuleList::gIntRuleList.GetRuleT(fOrdKsi);
    fOrdKsi = fIntKsi->Order();
}